

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_raffects(CHAR_DATA *ch,char *argument)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ROOM_AFFECT_DATA *pRVar5;
  RUNE_DATA *pRVar6;
  flag_type *pfVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char buf [4608];
  
  if (ch->in_room->affected == (ROOM_AFFECT_DATA *)0x0) {
    bVar3 = false;
  }
  else {
    send_to_char("The room is affected by:\n\r",ch);
    pRVar5 = ch->in_room->affected;
    bVar3 = true;
    if (pRVar5 != (ROOM_AFFECT_DATA *)0x0) {
      do {
        if (pRVar5->aftype == 0) {
          sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar5->type].name);
        }
        if (pRVar5->aftype == 1) {
          sprintf(buf,"Skill: \'%s\' ",skill_table[pRVar5->type].name);
        }
        if (pRVar5->aftype == 2) {
          sprintf(buf,"Power: \'%s\' ",skill_table[pRVar5->type].name);
        }
        if (pRVar5->aftype == 4) {
          sprintf(buf,"Commune: \'%s\' ",skill_table[pRVar5->type].name);
        }
        if (4 < (uint)pRVar5->aftype) {
          sprintf(buf,"Spell: \'%s\' ",skill_table[pRVar5->type].name);
        }
        send_to_char(buf,ch);
        pcVar4 = raffect_loc_name(0);
        pcVar8 = "aff";
        if (pRVar5->where == 1) {
          pcVar8 = "const";
        }
        if (pRVar5->where == 2) {
          pcVar8 = "flag";
        }
        pcVar9 = "none";
        if (pRVar5->owner != (CHAR_DATA *)0x0) {
          pcVar9 = pRVar5->owner->name;
        }
        sprintf(buf,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",pcVar4
                ,(ulong)(uint)(int)pRVar5->modifier,
                (ulong)(uint)((int)(short)(pRVar5->duration - (pRVar5->duration >> 0xf)) >> 1),
                pcVar8,"nullptr",pcVar9,(ulong)(uint)(int)pRVar5->level);
        send_to_char(buf,ch);
        pRVar5 = pRVar5->next;
      } while (pRVar5 != (ROOM_AFFECT_DATA *)0x0);
    }
  }
  if ((ch->in_room->has_rune == true) && (pRVar6 = ch->in_room->rune, pRVar6 != (RUNE_DATA *)0x0)) {
    do {
      pcVar4 = skill_table[pRVar6->type].name;
      bVar2 = is_npc(pRVar6->owner);
      sprintf(buf,"Rune \'%s\' placed in room by %s, level %d, duration %d hours.\n\r",pcVar4,
              (&pRVar6->owner->name)[!bVar2],(ulong)(uint)pRVar6->level,
              (ulong)(uint)pRVar6->duration);
      send_to_char(buf,ch);
      pRVar6 = pRVar6->next_content;
    } while (pRVar6 != (RUNE_DATA *)0x0);
  }
  pfVar7 = direction_table;
  lVar10 = 0;
  do {
    pEVar1 = ch->in_room->exit[lVar10];
    if ((pEVar1 != (EXIT_DATA *)0x0) && (pEVar1->has_rune == true)) {
      pRVar6 = pEVar1->rune;
      pcVar4 = skill_table[pRVar6->type].name;
      pcVar8 = pfVar7->name;
      bVar3 = is_npc(pRVar6->owner);
      sprintf(buf,"Rune \'%s\' placed on %s door by %s, level %d, duration %d hours.\n\r",pcVar4,
              pcVar8,(&pRVar6->owner->name)[!bVar3],(ulong)(uint)pRVar6->level,
              (ulong)(uint)pRVar6->duration);
      send_to_char(buf,ch);
      bVar3 = true;
    }
    lVar10 = lVar10 + 1;
    pfVar7 = pfVar7 + 1;
  } while (lVar10 != 6);
  if (!bVar3) {
    send_to_char("The room is not affected by anything.\n\r",ch);
  }
  return;
}

Assistant:

void do_raffects(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA *paf;
	RUNE_DATA *rune;
	char buf[MAX_STRING_LENGTH];
	bool found = false;
	int i = 0;

	if (ch->in_room->affected != nullptr)
	{
		found = true;
		send_to_char("The room is affected by:\n\r", ch);

		for (paf = ch->in_room->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->aftype == AFT_SPELL)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);

			if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);

			if (paf->aftype != AFT_SPELL && paf->aftype != AFT_SKILL && paf->aftype != AFT_POWER &&
				paf->aftype != AFT_MALADY && paf->aftype != AFT_COMMUNE)
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);
			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				raffect_loc_name(paf->location),
				paf->modifier,
				paf->duration / 2,
				paf->where == TO_ROOM_FLAGS ? "flag" : paf->where == TO_ROOM_CONST ? "const" : "aff",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}

	if (ch->in_room->has_rune)
	{
		for (rune = ch->in_room->rune; rune; rune = rune->next_content)
		{
			sprintf(buf, "Rune '%s' placed in room by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level,
				rune->duration);
			send_to_char(buf, ch);
		}
	}

	for (i = 0; i < 6; i++)
	{
		if (ch->in_room->exit[i] && ch->in_room->exit[i]->has_rune == true)
		{
			rune = ch->in_room->exit[i]->rune;

			sprintf(buf, "Rune '%s' placed on %s door by %s, level %d, duration %d hours.\n\r",
				skill_table[rune->type].name,
				direction_table[i].name,
				!is_npc(rune->owner) ? rune->owner->true_name : rune->owner->name,
				rune->level, rune->duration);
			send_to_char(buf, ch);

			found = true;
		}
	}

	if (!found)
		send_to_char("The room is not affected by anything.\n\r", ch);
}